

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::ProcessBailOutInfo(BackwardPass *this,Instr *instr,BailOutInfo *bailOutInfo)

{
  undefined1 *puVar1;
  Type TVar2;
  JitArenaAllocator *pJVar3;
  Type pJVar4;
  CapturedValues *pCVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  code *pcVar9;
  bool bVar10;
  BOOLEAN BVar11;
  uint32 offset;
  uint32 uVar12;
  BOOL BVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  RegSlot RVar17;
  int iVar18;
  undefined4 *puVar19;
  BVSparse<Memory::JitArenaAllocator> *pBVar20;
  Instr *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar21;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  Type *pTVar22;
  Instr *pIVar23;
  Type *pTVar24;
  StackSym *pSVar25;
  Type_conflict pBVar26;
  Func *this_02;
  BasicBlock *pBVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  BackwardPass *pBVar31;
  uint uVar32;
  anon_class_8_1_dda845c3 aVar33;
  ulong uVar34;
  long lVar35;
  Iterator local_80;
  BVSparse<Memory::JitArenaAllocator> *local_70;
  BasicBlock *local_68;
  BackwardPass *local_60;
  anon_class_8_1_dda845c3 iterator;
  BranchInstr *branchInstr;
  BVSparse<Memory::JitArenaAllocator> *local_40;
  
  pBVar27 = this->currentBlock;
  iterator.callback.this =
       (anon_class_8_1_8991fb9c_for_callback)(anon_class_8_1_8991fb9c_for_callback)instr;
  bVar10 = DoCaptureByteCodeUpwardExposedUsed(this);
  local_68 = pBVar27;
  if ((((bVar10) && (this->currentPrePassLoop == (Loop *)0x0)) &&
      (this_02 = bailOutInfo->bailOutFunc, this_02->topFunc->hasInstrNumber == false)) &&
     (this_02->byteCodeRegisterUses != (ByteCodeRegisterUses *)0x0)) {
    uVar32 = bailOutInfo->bailOutOffset;
    if (uVar32 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                          ,0xa77,"(offset != Js::Constants::NoByteCodeOffset)",
                          "offset != Js::Constants::NoByteCodeOffset");
      if (!bVar10) goto LAB_003da993;
      *puVar19 = 0;
      this_02 = bailOutInfo->bailOutFunc;
    }
    pBVar20 = Func::GetByteCodeOffsetUses(this_02,uVar32);
    aVar33 = iterator;
    if (pBVar20 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (*(char *)((long)iterator.callback.this + 0x39) == '\x02') {
        pIVar23 = *(Instr **)((long)iterator.callback.this + 0x68);
        offset = IR::Instr::GetByteCodeOffset(pIVar23);
        uVar12 = IR::Instr::GetByteCodeOffset((Instr *)aVar33.callback.this);
        if ((offset == uVar12) && (local_68 != (BasicBlock *)pIVar23[1].m_dst)) {
          if ((*(ushort *)&((BasicBlock *)pIVar23[1].m_dst)->field_0x18 & 0xf40) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar19 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                ,0xa8e,
                                "(target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource)"
                                ,
                                "target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource"
                               );
            if (!bVar10) goto LAB_003da993;
            *puVar19 = 0;
          }
          this_00 = IR::Instr::GetNextByteCodeInstr(pIVar23);
          offset = IR::Instr::GetByteCodeOffset(this_00);
        }
        pBVar21 = Func::GetByteCodeOffsetUses(pIVar23->m_func,offset);
        pBVar27 = local_68;
        if (pBVar21 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pBVar20 = BVSparse<Memory::JitArenaAllocator>::OrNew(pBVar20,pBVar21);
          if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar19 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                ,0xa99,"(trackingByteCodeUpwardExposedUsed)",
                                "trackingByteCodeUpwardExposedUsed");
            if (!bVar10) goto LAB_003da993;
            *puVar19 = 0;
            VerifyByteCodeUpwardExposed
                      (this,pBVar27,bailOutInfo->bailOutFunc,
                       (BVSparse<Memory::JitArenaAllocator> *)0x0,(Instr *)iterator.callback.this,
                       uVar32);
          }
          else {
            VerifyByteCodeUpwardExposed
                      (this,local_68,bailOutInfo->bailOutFunc,pBVar20,
                       (Instr *)iterator.callback.this,uVar32);
            Memory::
            DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                      (pBVar20->alloc,pBVar20);
            pBVar27 = local_68;
          }
          goto LAB_003d9c56;
        }
      }
      VerifyByteCodeUpwardExposed
                (this,pBVar27,bailOutInfo->bailOutFunc,pBVar20,(Instr *)iterator.callback.this,
                 uVar32);
    }
  }
LAB_003d9c56:
  if ((BackwardPass *)bailOutInfo->bailOutInstr != iterator.callback.this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0xaa3,"(bailOutInfo->bailOutInstr == instr)",
                        "bailOutInfo->bailOutInstr == instr");
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
  }
  if ((bailOutInfo->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     ((BVar13 = Func::HasTry(this->func), BVar13 == 0 ||
      (bVar10 = Func::DoOptimizeTry(this->func), !bVar10)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0xaa8,
                        "(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()))"
                        ,
                        "bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry())"
                       );
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
  }
  if (this->currentPrePassLoop == (Loop *)0x0) {
    local_40 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                         (pBVar27->byteCodeUpwardExposedUsed,this->func->m_alloc);
    bailOutInfo->byteCodeUpwardExposedUsed = local_40;
  }
  else {
    local_40 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                         (pBVar27->byteCodeUpwardExposedUsed,this->tempAlloc);
  }
  local_70 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3eba5c);
  pJVar3 = this->tempAlloc;
  local_70->head = (Type_conflict)0x0;
  local_70->lastFoundIndex = (Type_conflict)0x0;
  local_70->alloc = pJVar3;
  local_70->lastUsedNodePrevNextField = (Type)local_70;
  local_60 = this;
  if ((this->currentPrePassLoop == (Loop *)0x0) && (bailOutInfo->startCallCount != 0)) {
    uVar29 = 0;
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar32 = 0;
    do {
      uVar14 = BailOutInfo::GetStartCallOutParamCount(bailOutInfo,uVar32);
      uVar15 = uVar29;
      if (uVar14 != 0) {
        uVar15 = uVar14 + uVar29;
        do {
          pSVar25 = bailOutInfo->argOutSyms[uVar29];
          if (pSVar25 != (StackSym *)0x0) {
            StackSym::GetArgSlotNum(pSVar25);
            uVar16 = *(uint *)&pSVar25->field_0x18 & 0x100000;
            if ((uVar16 != 0) && (*(short *)&(pSVar25->super_Sym).field_0x16 == 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar19 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                  ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
              if (!bVar10) goto LAB_003da993;
              *puVar19 = 0;
              uVar16 = *(uint *)&pSVar25->field_0x18 & 0x100000;
            }
            if (uVar16 == 0) {
              BVSparse<Memory::JitArenaAllocator>::Set(local_70,(pSVar25->super_Sym).m_id);
            }
          }
          uVar29 = uVar29 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      uVar29 = uVar15;
      uVar32 = uVar32 + 1;
    } while (uVar32 < bailOutInfo->startCallCount);
  }
  pBVar31 = local_60;
  ProcessBailOutArgObj(local_60,bailOutInfo,local_40);
  aVar33 = iterator;
  pBVar20 = local_70;
  if (*(short *)((long)iterator.callback.this + 0x30) != 0x23f) {
    ProcessBailOutConstants(pBVar31,bailOutInfo,local_40,local_70);
    ProcessBailOutCopyProps(pBVar31,bailOutInfo,local_40,pBVar20);
  }
  this_01 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pBVar31->tempAlloc,0x3eba5c);
  pJVar4 = pBVar31->tempAlloc;
  this_01->head = (Type_conflict)0x0;
  this_01->lastFoundIndex = (Type_conflict)0x0;
  this_01->alloc = pJVar4;
  this_01->lastUsedNodePrevNextField = (Type)this_01;
  pBVar20 = bailOutInfo->liveVarSyms;
  pBVar21 = this_01;
  if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bVar10 = Func::DoGlobOpt(pBVar31->func);
    if (bVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                          ,0xb29,"(!this->func->DoGlobOpt())","!this->func->DoGlobOpt()");
      if (!bVar10) goto LAB_003da993;
      *puVar19 = 0;
    }
  }
  else {
    do {
      pBVar21 = (BVSparse<Memory::JitArenaAllocator> *)pBVar21->head;
      if (pBVar21 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003d9f9a;
    } while (((Type *)&pBVar21->alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0xad8,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
    pBVar20 = bailOutInfo->liveVarSyms;
LAB_003d9f9a:
    BVSparse<Memory::JitArenaAllocator>::Minus(this_01,local_40,pBVar20);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this_01,bailOutInfo->liveLosslessInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this_01,bailOutInfo->liveFloat64Syms);
    pBVar20 = this_01;
    do {
      pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)pBVar20->head;
      if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003da027;
    } while (((Type *)&pBVar20->alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0xade,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
LAB_003da027:
    bVar10 = Func::IsJitInDebugMode(pBVar31->func);
    if (bVar10) {
      pBVar20 = pBVar31->func->m_nonTempLocalVars;
      if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                            ,0xae5,"(this->func->m_nonTempLocalVars)",
                            "this->func->m_nonTempLocalVars");
        if (!bVar10) goto LAB_003da993;
        *puVar19 = 0;
        pBVar20 = pBVar31->func->m_nonTempLocalVars;
      }
      else {
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      BVSparse<Memory::JitArenaAllocator>::And(this_01,pBVar20,bailOutInfo->liveVarSyms);
      local_80.list = &bailOutInfo->usedCapturedValues->constantValues;
      local_80.current = &(local_80.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_003da15f:
      if ((CapturedValues *)local_80.current == (CapturedValues *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar19 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar10) goto LAB_003da993;
        *puVar19 = 0;
      }
      local_80.current =
           (((CapturedValues *)local_80.current)->constantValues).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      if ((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)local_80.current != local_80.list) {
        pTVar22 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data(&local_80);
        pSVar25 = pTVar22->key;
        if ((*(uint *)&pSVar25->field_0x18 >> 0xd & 1) == 0) goto code_r0x003da1d2;
        goto LAB_003da22e;
      }
      local_80.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)&bailOutInfo->usedCapturedValues->copyPropSyms;
      local_80.current = (NodeBase *)local_80.list;
      goto LAB_003da25d;
    }
LAB_003da36d:
    if (*(short *)&((BackwardPass *)aVar33.callback.this)->currentRegion != 0x23f) {
      BVSparse<Memory::JitArenaAllocator>::And(this_01,local_40,bailOutInfo->liveLosslessInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (local_40,this_01);
      pBVar26 = this_01->head;
      if (pBVar26 != (Type_conflict)0x0) {
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          uVar30 = (pBVar26->data).word;
          if (uVar30 != 0) {
            TVar2 = pBVar26->startIndex;
            uVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar34);
              pSVar25 = SymTable::FindStackSym(local_60->func->m_symTable,TVar2 + (BVIndex)uVar34);
              if (pSVar25->m_type != TyVar) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0xb0b,"(stackSym->GetType() == TyVar)",
                                    "stackSym->GetType() == TyVar");
                if (!bVar10) goto LAB_003da993;
                *puVar19 = 0;
              }
              pSVar25 = StackSym::GetInt32EquivSym(pSVar25,(Func *)0x0);
              if (pSVar25 == (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0xb0d,"(int32StackSym)","int32StackSym");
                if (!bVar10) goto LAB_003da993;
                *puVar19 = 0;
              }
              uVar30 = uVar30 & ~(1L << (uVar34 & 0x3f));
              BVSparse<Memory::JitArenaAllocator>::Set(local_40,(pSVar25->super_Sym).m_id);
              uVar34 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
            } while (uVar30 != 0);
          }
          pBVar26 = pBVar26->next;
        } while (pBVar26 != (Type)0x0);
      }
      BVSparse<Memory::JitArenaAllocator>::And(this_01,local_40,bailOutInfo->liveFloat64Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (local_40,this_01);
      pBVar26 = this_01->head;
      if (pBVar26 != (Type_conflict)0x0) {
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          uVar30 = (pBVar26->data).word;
          if (uVar30 != 0) {
            TVar2 = pBVar26->startIndex;
            uVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar34);
              pSVar25 = SymTable::FindStackSym(local_60->func->m_symTable,TVar2 + (BVIndex)uVar34);
              if (pSVar25->m_type != TyVar) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0xb18,"(stackSym->GetType() == TyVar)",
                                    "stackSym->GetType() == TyVar");
                if (!bVar10) goto LAB_003da993;
                *puVar19 = 0;
              }
              pSVar25 = StackSym::GetFloat64EquivSym(pSVar25,(Func *)0x0);
              if (pSVar25 == (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0xb1a,"(float64StackSym)","float64StackSym");
                if (!bVar10) goto LAB_003da993;
                *puVar19 = 0;
              }
              uVar30 = uVar30 & ~(1L << (uVar34 & 0x3f));
              BVSparse<Memory::JitArenaAllocator>::Set(local_40,(pSVar25->super_Sym).m_id);
              pSVar25->field_0x1a = pSVar25->field_0x1a | 2;
              uVar34 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
            } while (uVar30 != 0);
          }
          pBVar26 = pBVar26->next;
        } while (pBVar26 != (Type)0x0);
      }
    }
  }
  pBVar31 = local_60;
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (local_60->tempAlloc,this_01);
  aVar33 = iterator;
  if ((((*(short *)((long)iterator.callback.this + 0x30) == 0x237) &&
       (bVar10 = Func::IsInlinee(*(Func **)((long)iterator.callback.this + 0x20)), bVar10)) &&
      ((*(byte *)(*(long *)((long)aVar33.callback.this + 0x20) + 0x240) & 2) != 0)) &&
     (piVar6 = *(int **)(*(long *)((long)aVar33.callback.this + 0x20) + 0x2a0),
     (char)piVar6[0x12] == '\x01')) {
    lVar7 = *(long *)(piVar6 + 6);
    if (0 < *(int *)(lVar7 + 0x10)) {
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar35 = 0;
      lVar28 = 0;
      do {
        lVar8 = *(long *)(lVar7 + 8);
        iVar18 = *(int *)(lVar8 + lVar35);
        if (iVar18 == 1) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (local_60->currentBlock->upwardExposedUses,
                     *(BVIndex *)(*(long *)(lVar8 + 8 + lVar35) + 0x10));
          iVar18 = *(int *)(lVar8 + lVar35);
        }
        if (iVar18 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar19 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                              ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                              "value.type != InlineeFrameInfoValueType_None");
          if (!bVar10) goto LAB_003da993;
          *puVar19 = 0;
        }
        lVar28 = lVar28 + 1;
        lVar35 = lVar35 + 0x18;
      } while (lVar28 < *(int *)(lVar7 + 0x10));
    }
    pBVar31 = local_60;
    iVar18 = *piVar6;
    if (iVar18 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                          ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                          "function.type != InlineeFrameInfoValueType_None");
      if (!bVar10) {
LAB_003da993:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *puVar19 = 0;
      iVar18 = *piVar6;
    }
    if (iVar18 == 1) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (pBVar31->currentBlock->upwardExposedUses,*(BVIndex *)(*(long *)(piVar6 + 2) + 0x10)
                );
    }
  }
  pBVar27 = local_68;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (local_68->upwardExposedUses,local_40);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (pBVar27->upwardExposedUses,local_70);
  if ((pBVar31->currentPrePassLoop == (Loop *)0x0) && (bailOutInfo->startCallCount != 0)) {
    uVar29 = 0;
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar32 = 0;
    do {
      uVar14 = BailOutInfo::GetStartCallOutParamCount(bailOutInfo,uVar32);
      uVar15 = uVar29;
      if (uVar14 != 0) {
        uVar15 = uVar14 + uVar29;
        do {
          pSVar25 = bailOutInfo->argOutSyms[uVar29];
          if (pSVar25 != (StackSym *)0x0) {
            StackSym::GetArgSlotNum(pSVar25);
            uVar16 = *(uint *)&pSVar25->field_0x18 & 0x100000;
            if ((uVar16 != 0) && (*(short *)&(pSVar25->super_Sym).field_0x16 == 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar19 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                  ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
              if (!bVar10) goto LAB_003da993;
              *puVar19 = 0;
              uVar16 = *(uint *)&pSVar25->field_0x18 & 0x100000;
            }
            if ((uVar16 != 0) ||
               (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                                   (local_70,(pSVar25->super_Sym).m_id), BVar11 != '\0')) {
              puVar1 = &bailOutInfo->argOutSyms[uVar29]->field_0x18;
              *(uint *)puVar1 = *(uint *)puVar1 | 0x1000000;
            }
          }
          uVar29 = uVar29 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      uVar29 = uVar15;
      uVar32 = uVar32 + 1;
    } while (uVar32 < bailOutInfo->startCallCount);
  }
  pBVar31 = local_60;
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (local_60->tempAlloc,local_70);
  if (pBVar31->currentPrePassLoop != (Loop *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (pBVar31->tempAlloc,local_40);
  }
  return;
LAB_003da25d:
  if ((CapturedValues *)local_80.current == (CapturedValues *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                        ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
  }
  pCVar5 = (CapturedValues *)
           (((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)&(local_80.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (pCVar5 != (CapturedValues *)local_80.list) {
    local_80.current = (NodeBase *)pCVar5;
    pTVar24 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&local_80);
    pSVar25 = pTVar24->key;
    if ((*(uint *)&pSVar25->field_0x18 >> 0xd & 1) == 0) goto code_r0x003da2d0;
    goto LAB_003da32c;
  }
  pBVar20 = bailOutInfo->usedCapturedValues->argObjSyms;
  if (pBVar20 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>(this_01,pBVar20);
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>(local_40,this_01);
  aVar33 = iterator;
  goto LAB_003da36d;
code_r0x003da2d0:
  if ((*(uint *)&pSVar25->field_0x18 & 1) == 0) {
    pIVar23 = (Instr *)0x0;
  }
  else {
    pIVar23 = (pSVar25->field_5).m_instrDef;
  }
  if (pIVar23->m_opcode != BytecodeArgOutCapture) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0xaf4,
                        "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                        ,
                        "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                       );
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
    pSVar25 = pTVar24->key;
    if ((pSVar25->field_0x19 & 0x20) != 0) {
LAB_003da32c:
      RVar17 = StackSym::GetByteCodeRegSlot(pSVar25);
      BVSparse<Memory::JitArenaAllocator>::Clear(this_01,RVar17);
    }
  }
  goto LAB_003da25d;
code_r0x003da1d2:
  if ((*(uint *)&pSVar25->field_0x18 & 1) == 0) {
    pIVar23 = (Instr *)0x0;
  }
  else {
    pIVar23 = (pSVar25->field_5).m_instrDef;
  }
  if (pIVar23->m_opcode != BytecodeArgOutCapture) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar19 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0xaeb,
                        "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                        ,
                        "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                       );
    if (!bVar10) goto LAB_003da993;
    *puVar19 = 0;
    pSVar25 = pTVar22->key;
    if ((pSVar25->field_0x19 & 0x20) != 0) {
LAB_003da22e:
      RVar17 = StackSym::GetByteCodeRegSlot(pSVar25);
      BVSparse<Memory::JitArenaAllocator>::Clear(this_01,RVar17);
    }
  }
  goto LAB_003da15f;
}

Assistant:

void
BackwardPass::ProcessBailOutInfo(IR::Instr * instr, BailOutInfo * bailOutInfo)
{
    /*
    When we optimize functions having try-catch, we install a bailout at the starting of the catch block, namely, BailOnException.
    We don't have flow edges from all the possible exception points in the try to the catch block. As a result, this bailout should
    not try to restore from the constant values or copy-prop syms or the type specialized syms, as these may not necessarily be/have
    the right values. For example,

        //constant values
        c =
        try
        {
            <exception>
            c = k (constant)
        }
        catch
        {
            BailOnException
            = c  <-- We need to restore c from the value outside the try.
        }

        //copy-prop syms
        c =
        try
        {
            b = a
            <exception>
            c = b
        }
        catch
        {
            BailOnException
            = c  <-- We really want to restore c from its original sym, and not from its copy-prop sym, a
        }

        //type specialized syms
        a =
        try
        {
            <exception>
            a++  <-- type specializes a
        }
        catch
        {
            BailOnException
            = a  <-- We need to restore a from its var version.
        }
    */
    BasicBlock * block = this->currentBlock;
    BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed = nullptr;

#if DBG
    if (DoCaptureByteCodeUpwardExposedUsed() &&
        !IsPrePass() &&
        bailOutInfo->bailOutFunc->HasByteCodeOffset() &&
        bailOutInfo->bailOutFunc->byteCodeRegisterUses)
    {
        uint32 offset = bailOutInfo->bailOutOffset;
        Assert(offset != Js::Constants::NoByteCodeOffset);
        BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed = bailOutInfo->bailOutFunc->GetByteCodeOffsetUses(offset);
        if (trackingByteCodeUpwardExposedUsed)
        {
            BVSparse<JitArenaAllocator>* tmpBv = nullptr;
            if (instr->IsBranchInstr())
            {
                IR::BranchInstr* branchInstr = instr->AsBranchInstr();
                IR::LabelInstr* target = branchInstr->GetTarget();
                uint32 targetOffset = target->GetByteCodeOffset();

                // If the instr's label has the same bytecode offset as the instr then move the targetOffset
                // to the next bytecode instr. This can happen when we have airlock blocks or compensation
                // code, but also for infinite loops. Don't do it for the latter.
                if (targetOffset == instr->GetByteCodeOffset() && block != target->GetBasicBlock())
                {
                    // This can happen if the target is a break or airlock block.
                    Assert(
                        target->GetBasicBlock()->isAirLockBlock ||
                        target->GetBasicBlock()->isAirLockCompensationBlock ||
                        target->GetBasicBlock()->isBreakBlock ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSink ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSource
                    );
                    targetOffset = target->GetNextByteCodeInstr()->GetByteCodeOffset();
                }
                BVSparse<JitArenaAllocator>* branchTargetUpwardExposed = target->m_func->GetByteCodeOffsetUses(targetOffset);
                if (branchTargetUpwardExposed)
                {
                    // The bailout should restore both the bailout destination and
                    // the branch target since we don't know where we'll end up.
                    trackingByteCodeUpwardExposedUsed = tmpBv = trackingByteCodeUpwardExposedUsed->OrNew(branchTargetUpwardExposed);
                }
            }
            Assert(trackingByteCodeUpwardExposedUsed);
            VerifyByteCodeUpwardExposed(block, bailOutInfo->bailOutFunc, trackingByteCodeUpwardExposedUsed, instr, offset);
            if (tmpBv)
            {
                JitAdelete(tmpBv->GetAllocator(), tmpBv);
            }
        }
    }
#endif

    Assert(bailOutInfo->bailOutInstr == instr);

    // The byteCodeUpwardExposedUsed should only be assigned once. The only case which would break this
    // assumption is when we are optimizing a function having try-catch. In that case, we need the
    // byteCodeUpwardExposedUsed analysis in the initial backward pass too.
    Assert(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()));

    // Make a copy of the byteCodeUpwardExposedUsed so we can remove the constants
    if (!this->IsPrePass())
    {
        // Create the BV of symbols that need to be restored in the BailOutRecord
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->func->m_alloc);
        bailOutInfo->byteCodeUpwardExposedUsed = byteCodeUpwardExposedUsed;
    }
    else
    {
        // Create a temporary byteCodeUpwardExposedUsed
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->tempAlloc);
    }

    // All the register-based argument syms need to be tracked. They are either:
    //      1. Referenced as constants in bailOutInfo->usedcapturedValues.constantValues
    //      2. Referenced using copy prop syms in bailOutInfo->usedcapturedValues.copyPropSyms
    //      3. Marked as m_isBailOutReferenced = true & added to upwardExposedUsed bit vector to ensure we do not dead store their defs.
    //      The third set of syms is represented by the bailoutReferencedArgSymsBv.
    BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint, uint, StackSym* sym) {
            if (!sym->IsArgSlotSym())
            {
                bailoutReferencedArgSymsBv->Set(sym->m_id);
            }
        });
    }

    // Process Argument object first, as they can be found on the stack and don't need to rely on copy prop
    this->ProcessBailOutArgObj(bailOutInfo, byteCodeUpwardExposedUsed);

    if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
    {
        this->ProcessBailOutConstants(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
        this->ProcessBailOutCopyProps(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
    }

    BVSparse<JitArenaAllocator> * tempBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);

    if (bailOutInfo->liveVarSyms)
    {
        // Prefer to restore from type-specialized versions of the sym, as that will reduce the need for potentially expensive
        // ToVars that can more easily be eliminated due to being dead stores.

#if DBG
        Assert(tempBv->IsEmpty());

        // Verify that all syms to restore are live in some fashion
        tempBv->Minus(byteCodeUpwardExposedUsed, bailOutInfo->liveVarSyms);
        tempBv->Minus(bailOutInfo->liveLosslessInt32Syms);
        tempBv->Minus(bailOutInfo->liveFloat64Syms);
        Assert(tempBv->IsEmpty());
#endif

        if (this->func->IsJitInDebugMode())
        {
            // Add to byteCodeUpwardExposedUsed the non-temp local vars used so far to restore during bail out.
            // The ones that are not used so far will get their values from bytecode when we continue after bail out in interpreter.
            Assert(this->func->m_nonTempLocalVars);
            tempBv->And(this->func->m_nonTempLocalVars, bailOutInfo->liveVarSyms);

            // Remove syms that are restored in other ways than byteCodeUpwardExposedUsed.
            FOREACH_SLIST_ENTRY(ConstantStackSymValue, value, &bailOutInfo->usedCapturedValues->constantValues)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            FOREACH_SLIST_ENTRY(CopyPropSyms, value, &bailOutInfo->usedCapturedValues->copyPropSyms)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            if (bailOutInfo->usedCapturedValues->argObjSyms)
            {
                tempBv->Minus(bailOutInfo->usedCapturedValues->argObjSyms);
            }

            byteCodeUpwardExposedUsed->Or(tempBv);
        }

        if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
        {
            // Int32
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveLosslessInt32Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * int32StackSym = stackSym->GetInt32EquivSym(nullptr);
                Assert(int32StackSym);
                byteCodeUpwardExposedUsed->Set(int32StackSym->m_id);
            }
            NEXT_BITSET_IN_SPARSEBV;

            // Float64
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveFloat64Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * float64StackSym = stackSym->GetFloat64EquivSym(nullptr);
                Assert(float64StackSym);
                byteCodeUpwardExposedUsed->Set(float64StackSym->m_id);

                // This float-specialized sym is going to be used to restore the corresponding byte-code register. Need to
                // ensure that the float value can be precisely coerced back to the original Var value by requiring that it is
                // specialized using BailOutNumberOnly.
                float64StackSym->m_requiresBailOnNotNumber = true;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        // Var
        // Any remaining syms to restore will be restored from their var versions
    }
    else
    {
        Assert(!this->func->DoGlobOpt());
    }

    JitAdelete(this->tempAlloc, tempBv);

    // BailOnNoProfile makes some edges dead. Upward exposed symbols info set after the BailOnProfile won't
    // flow through these edges, and, in turn, not through predecessor edges of the block containing the
    // BailOnNoProfile. This is specifically bad for an inlinee's argout syms as they are set as upward exposed
    // when we see the InlineeEnd, but may not look so to some blocks and may get overwritten.
    // Set the argout syms as upward exposed here.
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile && instr->m_func->IsInlinee() &&
        instr->m_func->m_hasInlineArgsOpt && instr->m_func->frameInfo->isRecorded)
    {
        instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
        {
            this->currentBlock->upwardExposedUses->Set(argSym->m_id);
        });
    }

    // Mark all the register that we need to restore as used (excluding constants)
    block->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
    block->upwardExposedUses->Or(bailoutReferencedArgSymsBv);

    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint index, uint, StackSym* sym) {
            if (sym->IsArgSlotSym() || bailoutReferencedArgSymsBv->Test(sym->m_id))
            {
                bailOutInfo->argOutSyms[index]->m_isBailOutReferenced = true;
            }
        });
    }

    JitAdelete(this->tempAlloc, bailoutReferencedArgSymsBv);

    if (this->IsPrePass())
    {
        JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
    }
}